

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O3

int fi(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  long lVar13;
  
  lVar5 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x10);
  dVar2 = *(double *)((long)user_data + 0x18);
  dVar3 = *(double *)((long)user_data + 0x38);
  uVar6 = N_VGetSubvector_ManyVector(y,0);
  lVar7 = N_VGetArrayPointer(uVar6);
  if (lVar7 == 0) {
    fi_cold_6();
  }
  else {
    uVar6 = N_VGetSubvector_ManyVector(y,1);
    lVar8 = N_VGetArrayPointer(uVar6);
    if (lVar8 == 0) {
      fi_cold_5();
    }
    else {
      uVar6 = N_VGetSubvector_ManyVector(y,2);
      lVar9 = N_VGetArrayPointer(uVar6);
      if (lVar9 == 0) {
        fi_cold_4();
      }
      else {
        uVar6 = N_VGetSubvector_ManyVector(ydot,0);
        puVar10 = (undefined8 *)N_VGetArrayPointer(uVar6);
        if (puVar10 == (undefined8 *)0x0) {
          fi_cold_3();
        }
        else {
          uVar6 = N_VGetSubvector_ManyVector(ydot,1);
          puVar11 = (undefined8 *)N_VGetArrayPointer(uVar6);
          if (puVar11 == (undefined8 *)0x0) {
            fi_cold_2();
          }
          else {
            uVar6 = N_VGetSubvector_ManyVector(ydot,2);
            puVar12 = (undefined8 *)N_VGetArrayPointer(uVar6);
            if (puVar12 != (undefined8 *)0x0) {
              N_VConst(0,ydot);
              if (2 < lVar5) {
                lVar13 = 2;
                do {
                  dVar4 = *(double *)(lVar7 + -8 + lVar13 * 8);
                  puVar10[lVar13 + -1] =
                       *(double *)(lVar8 + -8 + lVar13 * 8) * dVar4 * dVar4 +
                       (dVar1 - (*(double *)(lVar9 + -8 + lVar13 * 8) + 1.0) * dVar4);
                  dVar4 = *(double *)(lVar7 + -8 + lVar13 * 8);
                  puVar11[lVar13 + -1] =
                       dVar4 * *(double *)(lVar9 + -8 + lVar13 * 8) -
                       *(double *)(lVar8 + -8 + lVar13 * 8) * dVar4 * dVar4;
                  dVar4 = *(double *)(lVar9 + -8 + lVar13 * 8);
                  puVar12[lVar13 + -1] =
                       (dVar2 - dVar4) / dVar3 - dVar4 * *(double *)(lVar7 + -8 + lVar13 * 8);
                  lVar13 = lVar13 + 1;
                } while (lVar5 != lVar13);
              }
              *puVar12 = 0;
              *puVar11 = 0;
              *puVar10 = 0;
              puVar12[lVar5 + -1] = 0;
              puVar11[lVar5 + -1] = 0;
              puVar10[lVar5 + -1] = 0;
              return 0;
            }
            fi_cold_1();
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int fi(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype a     = userdata->a;
  sunrealtype b     = userdata->b;
  sunrealtype ep    = userdata->ep;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *f_u = NULL, *f_v = NULL, *f_w = NULL;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  f_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 0));
  if (check_flag((void*)f_u, "N_VGetArrayPointer", 0)) { return 1; }
  f_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 1));
  if (check_flag((void*)f_v, "N_VGetArrayPointer", 0)) { return 1; }
  f_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 2));
  if (check_flag((void*)f_w, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in ODE RHS for u */
    f_u[i] = a - (y_w[i] + ONE) * y_u[i] + y_v[i] * y_u[i] * y_u[i];

    /* Fill in ODE RHS for v */
    f_v[i] = y_w[i] * y_u[i] - y_v[i] * y_u[i] * y_u[i];

    /* Fill in ODE RHS for w */
    f_w[i] = (b - y_w[i]) / ep - y_w[i] * y_u[i];
  }

  /* enforce stationary boundaries */
  f_u[0] = f_v[0] = f_w[0] = ZERO;
  f_u[N - 1] = f_v[N - 1] = f_w[N - 1] = ZERO;

  return 0; /* Return with success */
}